

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>,_2048UL,_2048UL>
::reentrant_put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                *i_queue,EasyRandom *param_2)

{
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  *this;
  TestObject<2048UL,_2048UL> *i_source;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *this_00;
  reentrant_put_transaction<void> *this_01;
  undefined8 in_RDX;
  ulong uVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> transaction;
  
  uVar1 = (ulong)&stack0xfffffffffffffff8 & 0xfffffffffffff800;
  *(undefined8 *)(uVar1 - 0x1030) = in_RDI;
  *(undefined8 *)(uVar1 - 0x1028) = in_RDI;
  *(undefined8 *)(uVar1 - 0x18) = in_RDI;
  *(undefined8 *)(uVar1 - 0x20) = in_RSI;
  *(undefined8 *)(uVar1 - 0x28) = in_RDX;
  *(undefined8 *)(uVar1 - 0x1020) = *(undefined8 *)(uVar1 - 0x20);
  *(TestObject<2048UL,_2048UL> **)(uVar1 - 0x1018) = (TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000);
  *(undefined8 *)(uVar1 - 0x1808) = 0x24a8b52;
  TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000));
  this = *(conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
           **)(uVar1 - 0x1020);
  i_source = *(TestObject<2048UL,_2048UL> **)(uVar1 - 0x1018);
  *(undefined8 *)(uVar1 - 0x1808) = 0x24a8b6f;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::start_reentrant_push<density_tests::TestObject<2048ul,2048ul>>
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar1 - 0x68)
             ,this,i_source);
  *(reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> **)(uVar1 - 0x1038) =
       (reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar1 - 0x68);
  *(undefined8 *)(uVar1 - 0x1808) = 0x24a8b8e;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::reentrant_put_transaction<density_tests::TestObject<2048ul,2048ul>>::
  reentrant_put_transaction<density_tests::TestObject<2048ul,2048ul>,void>
            ((reentrant_put_transaction<density_tests::TestObject<2048ul,2048ul>> *)(uVar1 - 0x48),
             (reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar1 - 0x68)
            );
  this_00 = *(reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> **)
             (uVar1 - 0x1038);
  *(undefined8 *)(uVar1 - 0x1808) = 0x24a8b9b;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction(this_00);
  *(undefined8 *)(uVar1 - 0x1808) = 0x24a8ba8;
  TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000));
  *(undefined8 *)(uVar1 - 0x1808) = 0x24a8bad;
  exception_checkpoint();
  this_01 = *(reentrant_put_transaction<void> **)(uVar1 - 0x1030);
  *(undefined8 *)(uVar1 - 0x1808) = 0x24a8bc4;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::reentrant_put_transaction<void>::
  reentrant_put_transaction<density_tests::TestObject<2048ul,2048ul>,void>
            (this_01,(reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
                     (uVar1 - 0x48));
  *(undefined8 *)(uVar1 - 0x1808) = 0x24a8bd1;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar1 - 0x48)
            );
  return *(reentrant_put_transaction<void> **)(uVar1 - 0x1028);
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }